

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O0

bool __thiscall
miniply::PLYReader::load_binary_scalar_property_big_endian
          (PLYReader *this,PLYProperty *prop,size_t *destIndex)

{
  size_t sVar1;
  bool bVar2;
  uchar *puVar3;
  size_t startIndex;
  size_t *destIndex_local;
  PLYProperty *prop_local;
  PLYReader *this_local;
  
  sVar1 = *destIndex;
  bVar2 = load_binary_scalar_property(this,prop,destIndex);
  if (bVar2) {
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_elementData);
    endian_swap(puVar3 + sVar1,prop->type);
  }
  return bVar2;
}

Assistant:

bool PLYReader::load_binary_scalar_property_big_endian(PLYProperty &prop, size_t &destIndex)
  {
    size_t startIndex = destIndex;
    if (load_binary_scalar_property(prop, destIndex)) {
      endian_swap(m_elementData.data() + startIndex, prop.type);
      return true;
    }
    else {
      return false;
    }
  }